

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::RandomOrderTexImage2DCase::createTexture(RandomOrderTexImage2DCase *this)

{
  int iVar1;
  int internalFormat;
  deUint32 type;
  deUint32 dVar2;
  int width;
  int height;
  char *str;
  reference pvVar3;
  iterator first;
  iterator last;
  void *data;
  PixelBufferAccess local_118;
  PixelBufferAccess local_f0;
  undefined1 local_c8 [8];
  Vec4 gMax;
  Vec4 gMin;
  int levelH;
  int levelW;
  int levelNdx;
  int ndx;
  int local_88;
  allocator<int> local_81;
  int i;
  vector<int,_std::allocator<int>_> levels;
  undefined1 local_58 [8];
  Random rnd;
  undefined1 local_40 [8];
  TextureLevel levelData;
  deUint32 tex;
  RandomOrderTexImage2DCase *this_local;
  
  levelData.m_data.m_cap._4_4_ = 0;
  rnd.m_rnd._8_8_ = glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_40,(TextureFormat *)&rnd.m_rnd.z);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(str);
  de::Random::Random((Random *)local_58,dVar2);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)((long)&levelData.m_data.m_cap + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,
             levelData.m_data.m_cap._4_4_);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,1);
  iVar1 = (this->super_Texture2DSpecCase).m_numLevels;
  std::allocator<int>::allocator(&local_81);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&i,(long)iVar1,&local_81);
  std::allocator<int>::~allocator(&local_81);
  for (local_88 = 0; local_88 < (this->super_Texture2DSpecCase).m_numLevels; local_88 = local_88 + 1
      ) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&i,(long)local_88);
    *pvVar3 = local_88;
  }
  first = std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)&i);
  last = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)&i);
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)local_58,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)last._M_current);
  for (levelW = 0; levelW < (this->super_Texture2DSpecCase).m_numLevels; levelW = levelW + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&i,(long)levelW);
    iVar1 = *pvVar3;
    levelH._0_1_ = (byte)iVar1;
    width = de::max<int>(1,(this->super_Texture2DSpecCase).m_width >> ((byte)levelH & 0x1f));
    height = de::max<int>(1,(this->super_Texture2DSpecCase).m_height >> ((byte)levelH & 0x1f));
    randomVector<4>((Functional *)(gMax.m_data + 2),(Random *)local_58,
                    &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMin,
                    &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMax);
    randomVector<4>((Functional *)local_c8,(Random *)local_58,
                    &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMin,
                    &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMax);
    tcu::TextureLevel::setSize((TextureLevel *)local_40,width,height,1);
    tcu::TextureLevel::getAccess(&local_f0,(TextureLevel *)local_40);
    tcu::fillWithComponentGradients(&local_f0,(Vec4 *)(gMax.m_data + 2),(Vec4 *)local_c8);
    internalFormat = *(int *)&(this->super_Texture2DSpecCase).field_0xd4;
    dVar2 = this->m_format;
    type = this->m_dataType;
    tcu::TextureLevel::getAccess(&local_118,(TextureLevel *)local_40);
    data = tcu::PixelBufferAccess::getDataPtr(&local_118);
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,
               iVar1,internalFormat,width,height,0,dVar2,type,data);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
  de::Random::~Random((Random *)local_58);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_40);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(m_format, m_dataType));
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		vector<int>			levels		(m_numLevels);

		for (int i = 0; i < m_numLevels; i++)
			levels[i] = i;
		rnd.shuffle(levels.begin(), levels.end());

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelNdx	= levels[ndx];
			int		levelW		= de::max(1, m_width	>> levelNdx);
			int		levelH		= de::max(1, m_height	>> levelNdx);
			Vec4	gMin		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4	gMax		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			levelData.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(GL_TEXTURE_2D, levelNdx, m_internalFormat, levelW, levelH, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
		}
	}